

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall Builder::FinishCommand(Builder *this,Result *result,string *err)

{
  Edge *this_00;
  BindingEnv *pBVar1;
  BuildLog *this_01;
  Node *node;
  Metrics *this_02;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  int *piVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  undefined4 extraout_var_02;
  Metric *pMVar10;
  pointer ppNVar11;
  TimeStamp mtime;
  allocator<char> local_161;
  string *local_160;
  string rspfile;
  int end_time;
  int start_time;
  string deps_type;
  string local_108;
  string deps_prefix;
  vector<Node_*,_std::allocator<Node_*>_> deps_nodes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ScopedMetric metrics_h_scoped;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  local_160 = err;
  if ((FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar5 = __cxa_guard_acquire(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                                   metrics_h_metric), this_02 = g_metrics, iVar5 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar10 = (Metric *)0x0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&deps_type,"FinishCommand",(allocator<char> *)&deps_prefix);
      pMVar10 = Metrics::NewMetric(this_02,&deps_type);
      std::__cxx11::string::~string((string *)&deps_type);
    }
    FinishCommand::metrics_h_metric = pMVar10;
    __cxa_guard_release(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&metrics_h_scoped,FinishCommand::metrics_h_metric);
  this_00 = result->edge;
  deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&deps_prefix,"deps",(allocator<char> *)&rspfile);
  Edge::GetBinding(&deps_type,this_00,&deps_prefix);
  std::__cxx11::string::~string((string *)&deps_prefix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rspfile,"msvc_deps_prefix",(allocator<char> *)&local_108);
  Edge::GetBinding(&deps_prefix,this_00,&rspfile);
  std::__cxx11::string::~string((string *)&rspfile);
  if (deps_type._M_string_length != 0) {
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    rspfile._M_string_length = 0;
    rspfile.field_2._M_local_buf[0] = '\0';
    bVar2 = ExtractDeps(this,result,&deps_type,&deps_prefix,&deps_nodes,&rspfile);
    if ((!bVar2) && (result->status == ExitSuccess)) {
      if ((result->output)._M_string_length != 0) {
        std::__cxx11::string::append((char *)&result->output);
      }
      std::__cxx11::string::append((string *)&result->output);
      result->status = ExitFailure;
    }
    std::__cxx11::string::~string((string *)&rspfile);
  }
  BuildStatus::BuildEdgeFinished
            (this->status_,this_00,result->status == ExitSuccess,&result->output,&start_time,
             &end_time);
  if (result->status != ExitSuccess) {
    bVar2 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeFailed,local_160);
    goto LAB_00164c55;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rspfile,"restat",(allocator<char> *)&local_108);
  bVar2 = Edge::GetBindingBool(this_00,&rspfile);
  std::__cxx11::string::~string((string *)&rspfile);
  if (this->config_->dry_run == false) {
    mtime = 0;
    bVar3 = false;
    for (ppNVar11 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppNVar11 !=
        (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppNVar11 = ppNVar11 + 1) {
      iVar5 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                        (this->disk_interface_,&(*ppNVar11)->env_path_,local_160);
      lVar8 = CONCAT44(extraout_var_00,iVar5);
      if (lVar8 == -1) goto LAB_00164c53;
      if (mtime < lVar8) {
        mtime = lVar8;
      }
      if ((*ppNVar11)->mtime_ == lVar8 && bVar2) {
        bVar4 = Plan::CleanNode(&this->plan_,&this->scan_,*ppNVar11,local_160);
        bVar3 = true;
        if (!bVar4) goto LAB_00164c53;
      }
    }
    if (!bVar3) goto LAB_00164894;
    lVar8 = 0;
    for (ppNVar11 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppNVar11 !=
        (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
        ppNVar11 = ppNVar11 + 1) {
      iVar5 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                        (this->disk_interface_,&(*ppNVar11)->env_path_,local_160);
      lVar9 = CONCAT44(extraout_var_01,iVar5);
      if (lVar9 == -1) goto LAB_00164c53;
      if (lVar8 < lVar9) {
        lVar8 = lVar9;
      }
    }
    Edge::GetUnescapedDepfile_abi_cxx11_(&rspfile,this_00);
    if (lVar8 == 0) {
      lVar8 = 0;
LAB_00164c2e:
      this->status_->total_edges_ = (this->plan_).command_edges_;
      bVar2 = true;
    }
    else {
      if ((deps_type._M_string_length != 0) || (rspfile._M_string_length == 0)) goto LAB_00164c2e;
      pBVar1 = this_00->env_;
      std::__cxx11::string::string((string *)&local_50,(string *)&rspfile);
      RelPathEnv::ApplyChdir(&local_108,&pBVar1->super_RelPathEnv,&local_50);
      std::__cxx11::string::operator=((string *)&rspfile,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_50);
      iVar5 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                        (this->disk_interface_,&rspfile,local_160);
      lVar9 = CONCAT44(extraout_var_02,iVar5);
      if (lVar8 < lVar9) {
        lVar8 = lVar9;
      }
      if (lVar9 != -1) goto LAB_00164c2e;
      bVar2 = false;
      lVar8 = mtime;
    }
    std::__cxx11::string::~string((string *)&rspfile);
    mtime = lVar8;
    if (bVar2) goto LAB_00164894;
  }
  else {
    mtime = 0;
LAB_00164894:
    bVar2 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeSucceeded,local_160);
    if (bVar2) {
      Edge::GetUnescapedRspfile_abi_cxx11_(&rspfile,this_00);
      if ((rspfile._M_string_length != 0) && (g_keep_rsp == false)) {
        pBVar1 = this_00->env_;
        std::__cxx11::string::string((string *)&local_70,(string *)&rspfile);
        RelPathEnv::ApplyChdir(&local_108,&pBVar1->super_RelPathEnv,&local_70);
        std::__cxx11::string::operator=((string *)&rspfile,(string *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_70);
        (*(this->disk_interface_->super_FileReader)._vptr_FileReader[8])
                  (this->disk_interface_,&rspfile);
      }
      this_01 = (this->scan_).build_log_;
      if ((this_01 == (BuildLog *)0x0) ||
         (bVar2 = BuildLog::RecordCommand(this_01,this_00,start_time,end_time,mtime), bVar2)) {
        bVar2 = true;
        if ((deps_type._M_string_length != 0) && (this->config_->dry_run == false)) {
          ppNVar11 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
          if ((long)(this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppNVar11 != 8) {
            __assert_fail("edge->outputs_.size() == 1 && \"should have been rejected by parser\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build.cc"
                          ,0x41e,"bool Builder::FinishCommand(CommandRunner::Result *, string *)");
          }
          node = *ppNVar11;
          iVar5 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                            (this->disk_interface_,&node->env_path_,local_160);
          if (CONCAT44(extraout_var,iVar5) == -1) goto LAB_00164b6d;
          bVar3 = DepsLog::RecordDeps((this->scan_).dep_loader_.deps_log_,node,
                                      CONCAT44(extraout_var,iVar5),&deps_nodes);
          if (!bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a0,"Error writing to deps log: ",&local_161);
            piVar6 = __errno_location();
            pcVar7 = strerror(*piVar6);
            std::operator+(&local_108,&local_a0,pcVar7);
            goto LAB_00164b46;
          }
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"Error writing to build log: ",&local_161);
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        std::operator+(&local_108,&local_a0,pcVar7);
LAB_00164b46:
        std::__cxx11::string::operator=((string *)local_160,(string *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_a0);
LAB_00164b6d:
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&rspfile);
      goto LAB_00164c55;
    }
  }
LAB_00164c53:
  bVar2 = false;
LAB_00164c55:
  std::__cxx11::string::~string((string *)&deps_prefix);
  std::__cxx11::string::~string((string *)&deps_type);
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  ScopedMetric::~ScopedMetric(&metrics_h_scoped);
  return bVar2;
}

Assistant:

bool Builder::FinishCommand(CommandRunner::Result* result, string* err) {
  METRIC_RECORD("FinishCommand");

  Edge* edge = result->edge;

  // First try to extract dependencies from the result, if any.
  // This must happen first as it filters the command output (we want
  // to filter /showIncludes output, even on compile failure) and
  // extraction itself can fail, which makes the command fail from a
  // build perspective.
  vector<Node*> deps_nodes;
  string deps_type = edge->GetBinding("deps");
  const string deps_prefix = edge->GetBinding("msvc_deps_prefix");
  if (!deps_type.empty()) {
    string extract_err;
    if (!ExtractDeps(result, deps_type, deps_prefix, &deps_nodes,
                     &extract_err) &&
        result->success()) {
      if (!result->output.empty())
        result->output.append("\n");
      result->output.append(extract_err);
      result->status = ExitFailure;
    }
  }

  int start_time, end_time;
  status_->BuildEdgeFinished(edge, result->success(), result->output,
                             &start_time, &end_time);

  // The rest of this function only applies to successful commands.
  if (!result->success()) {
    return plan_.EdgeFinished(edge, Plan::kEdgeFailed, err);
  }

  // Restat the edge outputs
  TimeStamp output_mtime = 0;
  bool restat = edge->GetBindingBool("restat");
  if (!config_.dry_run) {
    bool node_cleaned = false;

    for (vector<Node*>::iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), err);
      if (new_mtime == -1)
        return false;
      if (new_mtime > output_mtime)
        output_mtime = new_mtime;
      if ((*o)->mtime() == new_mtime && restat) {
        // The rule command did not change the output.  Propagate the clean
        // state through the build graph.
        // Note that this also applies to nonexistent outputs (mtime == 0).
        if (!plan_.CleanNode(&scan_, *o, err))
          return false;
        node_cleaned = true;
      }
    }

    if (node_cleaned) {
      TimeStamp restat_mtime = 0;
      // If any output was cleaned, find the most recent mtime of any
      // (existing) non-order-only input or the depfile.
      for (vector<Node*>::iterator i = edge->inputs_.begin();
           i != edge->inputs_.end() - edge->order_only_deps_; ++i) {
        TimeStamp input_mtime = disk_interface_->Stat((*i)->path(), err);
        if (input_mtime == -1)
          return false;
        if (input_mtime > restat_mtime)
          restat_mtime = input_mtime;
      }

      // The depfile will not have current chdir and must be fixed up.
      // But first detect whether depfile was absent.
      string depfile = edge->GetUnescapedDepfile();
      if (restat_mtime != 0 && deps_type.empty() && !depfile.empty()) {
        // Apply chdir fixup.
        depfile = edge->env_->ApplyChdir(depfile);
        TimeStamp depfile_mtime = disk_interface_->Stat(depfile, err);
        if (depfile_mtime == -1)
          return false;
        if (depfile_mtime > restat_mtime)
          restat_mtime = depfile_mtime;
      }

      // The total number of edges in the plan may have changed as a result
      // of a restat.
      status_->PlanHasTotalEdges(plan_.command_edge_count());

      output_mtime = restat_mtime;
    }
  }

  if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err))
    return false;

  // Delete any left over response file.
  // The rspfile will not have current chdir and must be fixed up.
  // But first detect whether rspfile was absent.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty() && !g_keep_rsp) {
    // Apply chdir fixup.
    rspfile = edge->env_->ApplyChdir(rspfile);
    disk_interface_->RemoveFile(rspfile);
  }

  if (scan_.build_log()) {
    if (!scan_.build_log()->RecordCommand(edge, start_time, end_time,
                                          output_mtime)) {
      *err = string("Error writing to build log: ") + strerror(errno);
      return false;
    }
  }

  if (!deps_type.empty() && !config_.dry_run) {
    assert(edge->outputs_.size() == 1 && "should have been rejected by parser");
    Node* out = edge->outputs_[0];
    TimeStamp deps_mtime = disk_interface_->Stat(out->path(), err);
    if (deps_mtime == -1)
      return false;
    if (!scan_.deps_log()->RecordDeps(out, deps_mtime, deps_nodes)) {
      *err = string("Error writing to deps log: ") + strerror(errno);
      return false;
    }
  }
  return true;
}